

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateStaticMembers
          (StringFieldGenerator *this,Printer *printer)

{
  ulong uVar1;
  Printer *in_RDI;
  Formatter format;
  Formatter *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffd8;
  Formatter *in_stack_ffffffffffffffe0;
  
  Formatter::Formatter
            (in_stack_ffffffffffffffa0,in_RDI,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x5716da);
  FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)in_RDI->output_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Formatter::operator()<>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  Formatter::~Formatter((Formatter *)0x571735);
  return;
}

Assistant:

void StringFieldGenerator::GenerateStaticMembers(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (!descriptor_->default_value_string().empty()) {
    // We make the default instance public, so it can be initialized by
    // non-friend code.
    format(
        "public:\n"
        "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string>"
        " $default_variable_name$;\n"
        "private:\n");
  }
}